

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  ushort *puVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t __n;
  BYTE *s;
  ushort *puVar13;
  ushort *puVar14;
  int iVar15;
  BYTE *d;
  char *__dest;
  long lStack_90;
  int local_68;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar15 = -1;
  if (-1 < dstCapacity && src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar15 = 0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(src + compressedSize);
      pcVar2 = dst + (uint)dstCapacity;
      puVar9 = (ushort *)src;
      __dest = dst;
LAB_00112585:
      do {
        puVar14 = (ushort *)((long)puVar9 + 1);
        bVar3 = (byte)*puVar9;
        uVar7 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          lStack_90 = -1;
          if (puVar14 < pbVar1 + -0xf) {
            lStack_90 = 0;
            puVar9 = puVar9 + 1;
            do {
              puVar14 = puVar9;
              if (pbVar1 + -0xf < puVar14) {
                lStack_90 = -1;
                break;
              }
              lStack_90 = lStack_90 + (ulong)*(byte *)((long)puVar14 + -1);
              puVar9 = (ushort *)((long)puVar14 + 1);
            } while ((ulong)*(byte *)((long)puVar14 + -1) == 0xff);
          }
          puVar9 = puVar14;
          cVar8 = '\x05';
          uVar7 = 0xf;
          if ((lStack_90 != -1) && (uVar7 = lStack_90 + 0xf, !CARRY8((ulong)__dest,uVar7))) {
            cVar8 = CARRY8((ulong)puVar9,uVar7) * '\x05';
          }
          puVar14 = puVar9;
          if (cVar8 != '\0') {
            if (cVar8 != '\x05') {
              return (int)puVar9;
            }
            goto LAB_00112872;
          }
LAB_001125fc:
          pcVar12 = __dest + uVar7;
          if ((pcVar2 + -0xc < pcVar12) ||
             (puVar13 = (ushort *)(uVar7 + (long)puVar14), pbVar1 + -8 < puVar13)) {
            if (pbVar1 < (byte *)(uVar7 + (long)puVar14)) {
              pcVar12 = __dest + ((long)pbVar1 - (long)puVar14);
              uVar7 = (long)pbVar1 - (long)puVar14;
            }
            __n = (long)pcVar2 - (long)__dest;
            if (pcVar12 <= pcVar2) {
              __n = uVar7;
            }
            memmove(__dest,puVar14,__n);
            __dest = __dest + __n;
            if ((pcVar2 <= pcVar12) ||
               (puVar13 = (ushort *)((long)puVar14 + __n), pcVar12 = __dest, pbVar1 + -2 <= puVar13)
               ) break;
          }
          else {
            do {
              *(undefined8 *)__dest = *(undefined8 *)puVar14;
              __dest = __dest + 8;
              puVar14 = puVar14 + 4;
            } while (__dest < pcVar12);
          }
          uVar6 = (uint)*puVar13;
          puVar9 = puVar13 + 1;
          pcVar11 = pcVar12 + -(ulong)*puVar13;
          uVar10 = (ulong)(bVar3 & 0xf);
        }
        else {
          if ((src + (long)compressedSize + -0x10 <= puVar14) ||
             (dst + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_001125fc;
          uVar4 = *(undefined8 *)((long)puVar9 + 9);
          *(undefined8 *)__dest = *(undefined8 *)puVar14;
          *(undefined8 *)(__dest + 8) = uVar4;
          pcVar12 = __dest + uVar7;
          uVar10 = (ulong)(bVar3 & 0xf);
          puVar9 = (ushort *)(uVar7 + (long)puVar14) + 1;
          uVar5 = *(ushort *)(uVar7 + (long)puVar14);
          uVar6 = (uint)uVar5;
          pcVar11 = pcVar12 + -(ulong)uVar5;
          if (((uVar10 != 0xf) && (7 < uVar5)) && (dst <= pcVar11)) {
            *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
            *(undefined8 *)(pcVar12 + 8) = *(undefined8 *)(pcVar11 + 8);
            *(undefined2 *)(pcVar12 + 0x10) = *(undefined2 *)(pcVar11 + 0x10);
            __dest = pcVar12 + uVar10 + 4;
            goto LAB_00112585;
          }
        }
        if ((int)uVar10 == 0xf) {
          lStack_90 = 0;
          puVar14 = puVar9;
          do {
            puVar9 = (ushort *)((long)puVar14 + 1);
            if (pbVar1 + -4 < puVar9) {
              lStack_90 = -1;
              break;
            }
            uVar5 = *puVar14;
            lStack_90 = lStack_90 + (ulong)(byte)uVar5;
            puVar14 = puVar9;
          } while ((ulong)(byte)uVar5 == 0xff);
          uVar10 = lStack_90 + 0xf;
          if ((lStack_90 == -1) || (CARRY8((ulong)pcVar12,uVar10))) goto LAB_00112872;
        }
        if (pcVar11 < dst) {
LAB_00112872:
          local_68 = (int)src;
          return ~(uint)puVar9 + local_68;
        }
        uVar10 = uVar10 + 4;
        __dest = pcVar12 + uVar10;
        if (__dest <= pcVar2 + -0xc) {
          if (uVar6 < 8) {
            pcVar12[0] = '\0';
            pcVar12[1] = '\0';
            pcVar12[2] = '\0';
            pcVar12[3] = '\0';
            *pcVar12 = *pcVar11;
            pcVar12[1] = pcVar11[1];
            pcVar12[2] = pcVar11[2];
            pcVar12[3] = pcVar11[3];
            uVar7 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar6 << 2));
            *(undefined4 *)(pcVar12 + 4) = *(undefined4 *)(pcVar11 + uVar7);
            pcVar11 = pcVar11 + (uVar7 - (long)*(int *)((long)dec64table + (ulong)(uVar6 << 2)));
          }
          else {
            *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
            pcVar11 = pcVar11 + 8;
          }
          *(undefined8 *)(pcVar12 + 8) = *(undefined8 *)pcVar11;
          if (0x10 < uVar10) {
            pcVar12 = pcVar12 + 0x10;
            do {
              pcVar11 = pcVar11 + 8;
              *(undefined8 *)pcVar12 = *(undefined8 *)pcVar11;
              pcVar12 = pcVar12 + 8;
            } while (pcVar12 < __dest);
          }
          goto LAB_00112585;
        }
        uVar7 = (long)pcVar2 - (long)pcVar12;
        if (uVar10 < (ulong)((long)pcVar2 - (long)pcVar12)) {
          uVar7 = uVar10;
        }
        __dest = pcVar12 + uVar7;
        if (pcVar12 < pcVar11 + uVar7) {
          if (0 < (long)uVar7) {
            do {
              cVar8 = *pcVar11;
              pcVar11 = pcVar11 + 1;
              *pcVar12 = cVar8;
              pcVar12 = pcVar12 + 1;
            } while (pcVar12 < __dest);
          }
        }
        else {
          memcpy(pcVar12,pcVar11,uVar7);
        }
      } while (__dest != pcVar2);
      iVar15 = (int)__dest - (int)dst;
    }
  }
  return iVar15;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}